

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

bool sglr::isValidStencilOp(deUint32 op)

{
  if ((int)op < 0x8507) {
    if (((3 < op - 0x1e00) && (op != 0)) && (op != 0x150a)) {
      return false;
    }
  }
  else if (1 < op - 0x8507) {
    return false;
  }
  return true;
}

Assistant:

static bool isValidStencilOp (deUint32 op)
{
	switch (op)
	{
		case GL_KEEP:
		case GL_ZERO:
		case GL_REPLACE:
		case GL_INCR:
		case GL_INCR_WRAP:
		case GL_DECR:
		case GL_DECR_WRAP:
		case GL_INVERT:
			return true;

		default:
			return false;
	}
}